

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::BuildIntersectList(Clipper *this,long64 botY,long64 topY)

{
  bool bVar1;
  long64 lVar2;
  bool bVar3;
  TEdge *pTVar4;
  TEdge *edge1;
  IntPoint local_48;
  
  pTVar4 = this->m_ActiveEdges;
  if (pTVar4 != (TEdge *)0x0) {
    lVar2 = TopX(pTVar4,topY);
    pTVar4->tmpX = lVar2;
    this->m_SortedEdges = pTVar4;
    pTVar4->prevInSEL = (TEdge *)0x0;
    while (pTVar4 = pTVar4->nextInAEL, pTVar4 != (TEdge *)0x0) {
      pTVar4->prevInSEL = pTVar4->prevInAEL;
      pTVar4->prevInAEL->nextInSEL = pTVar4;
      pTVar4->nextInSEL = (TEdge *)0x0;
      lVar2 = TopX(pTVar4,topY);
      pTVar4->tmpX = lVar2;
    }
    bVar3 = true;
    while ((bVar3 && (this->m_SortedEdges != (TEdge *)0x0))) {
      bVar3 = false;
      pTVar4 = this->m_SortedEdges;
      while (edge1 = pTVar4, pTVar4 = edge1->nextInSEL, pTVar4 != (TEdge *)0x0) {
        local_48.X = 0;
        local_48.Y = 0;
        if ((pTVar4->tmpX < edge1->tmpX) &&
           (bVar1 = IntersectPoint(edge1,pTVar4,&local_48,
                                   (bool)(this->_vptr_Clipper[-3] + 0x10)
                                         [(long)&(this->m_PolyOuts).
                                                 super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                         ]), bVar1)) {
          if (botY < local_48.Y) {
            local_48.Y = botY;
            local_48.X = TopX(edge1,botY);
          }
          AddIntersectNode(this,edge1,pTVar4,&local_48);
          SwapPositionsInSEL(this,edge1,pTVar4);
          bVar3 = true;
          pTVar4 = edge1;
        }
      }
      if (edge1->prevInSEL == (TEdge *)0x0) break;
      edge1->prevInSEL->nextInSEL = (TEdge *)0x0;
    }
    this->m_SortedEdges = (TEdge *)0x0;
  }
  return;
}

Assistant:

void Clipper::BuildIntersectList(const long64 botY, const long64 topY)
{
  if ( !m_ActiveEdges ) return;

  //prepare for sorting ...
  TEdge* e = m_ActiveEdges;
  e->tmpX = TopX( *e, topY );
  m_SortedEdges = e;
  m_SortedEdges->prevInSEL = 0;
  e = e->nextInAEL;
  while( e )
  {
    e->prevInSEL = e->prevInAEL;
    e->prevInSEL->nextInSEL = e;
    e->nextInSEL = 0;
    e->tmpX = TopX( *e, topY );
    e = e->nextInAEL;
  }

  //bubblesort ...
  bool isModified = true;
  while( isModified && m_SortedEdges )
  {
    isModified = false;
    e = m_SortedEdges;
    while( e->nextInSEL )
    {
      TEdge *eNext = e->nextInSEL;
      IntPoint pt;
      if(e->tmpX > eNext->tmpX &&
        IntersectPoint(*e, *eNext, pt, m_UseFullRange))
      {
        if (pt.Y > botY)
        {
            pt.Y = botY;
            pt.X = TopX(*e, pt.Y);
        }
        AddIntersectNode( e, eNext, pt );
        SwapPositionsInSEL(e, eNext);
        isModified = true;
      }
      else
        e = eNext;
    }
    if( e->prevInSEL ) e->prevInSEL->nextInSEL = 0;
    else break;
  }
  m_SortedEdges = 0;
}